

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O1

void __thiscall QtMWidgets::Picker::mouseReleaseEvent(Picker *this,QMouseEvent *event)

{
  int iVar1;
  PickerPrivate *pPVar2;
  int iVar3;
  QMouseEvent QVar4;
  double dVar5;
  double in_XMM1_Qa;
  QPoint local_20;
  
  if (*(int *)(event + 0x40) == 1) {
    pPVar2 = (this->d).d;
    pPVar2->leftMouseButtonPressed = false;
    if (pPVar2->mouseWasMoved == true) {
      iVar1 = pPVar2->mouseMoveDelta;
      iVar3 = FingerGeometry::touchBounce();
      QVar4 = (QMouseEvent)0x1;
      if (iVar3 < iVar1) goto LAB_00173574;
    }
    pPVar2 = (this->d).d;
    dVar5 = (double)QEventPoint::position();
    local_20.xp = (int)((double)((ulong)dVar5 & 0x8000000000000000 | 0x3fe0000000000000) + dVar5);
    local_20.yp = (int)((double)((ulong)in_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                       in_XMM1_Qa);
    PickerPrivate::setCurrentIndex(pPVar2,&local_20);
    QVar4 = (QMouseEvent)0x1;
  }
  else {
    QVar4 = (QMouseEvent)0x0;
  }
LAB_00173574:
  event[0xc] = QVar4;
  return;
}

Assistant:

void
Picker::mouseReleaseEvent( QMouseEvent * event )
{
	if( event->button() == Qt::LeftButton )
	{
		d->leftMouseButtonPressed = false;

		if( !d->mouseWasMoved
			|| d->mouseMoveDelta <= FingerGeometry::touchBounce() )
				d->setCurrentIndex( event->pos() );

		event->accept();
	}
	else
		event->ignore();
}